

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferReader.hh
# Opt level: O1

ssize_t __thiscall avro::BufferReader::read(BufferReader *this,int __fd,void *__buf,size_t __nbytes)

{
  void *pvVar1;
  undefined4 in_register_00000034;
  void *__src;
  void *pvVar2;
  void *__dest;
  
  __dest = (void *)CONCAT44(in_register_00000034,__fd);
  pvVar2 = *(void **)(this + 0x38);
  pvVar1 = __buf;
  if (pvVar2 < __buf) {
    __buf = pvVar2;
    pvVar1 = pvVar2;
  }
  for (; __buf != (void *)0x0; __buf = (void *)((long)__buf - (long)pvVar2)) {
    __src = (void *)(*(long *)(this + 0x40) + *(long *)(*(long *)(this + 0x10) + 0x20));
    pvVar2 = (void *)(*(long *)(*(long *)(this + 0x10) + 0x28) - (long)__src);
    if (__buf <= pvVar2) {
      pvVar2 = __buf;
    }
    memcpy(__dest,__src,(size_t)pvVar2);
    __dest = (void *)((long)__dest + (long)pvVar2);
    incrementChunk(this,(size_type)pvVar2);
  }
  return (ssize_t)pvVar1;
}

Assistant:

size_type read(data_type *data, size_type size) { 

        if(size > bytesRemaining_) {
            size = bytesRemaining_;
        }
        size_type sizeToRead = size;

        while(sizeToRead) {
            const size_type toRead = std::min(sizeToRead, chunkRemaining());
            memcpy(data, addr(), toRead);
            sizeToRead -= toRead;
            data += toRead;
            incrementChunk(toRead);
        }

        return size;
    }